

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TValue * rec_mm_concat_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  TRef TVar1;
  TRef TVar2;
  void *in_RDX;
  long in_RDI;
  TRef *base;
  TRef *xbase;
  TRef *trp;
  TRef hdr;
  TRef tr;
  RecordIndex ix;
  BCReg s;
  TRef *top;
  BCReg topslot;
  BCReg baseslot;
  jit_State *J;
  RecCatDataCP *rcd;
  int32_t in_stack_fffffffffffffe3c;
  jit_State *in_stack_fffffffffffffe40;
  jit_State *in_stack_fffffffffffffe48;
  jit_State *in_stack_fffffffffffffe50;
  jit_State *pjVar3;
  jit_State *pjVar4;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  TValue local_198;
  TValue local_190 [5];
  int local_168;
  TRef local_164;
  uint local_14c;
  jit_State *local_148;
  uint local_140;
  uint local_13c;
  jit_State *local_138;
  void *local_130;
  long local_118;
  IRRef1 local_106;
  IRRef1 local_104;
  undefined2 local_102;
  jit_State *local_100;
  IRRef1 local_f6;
  IRRef1 local_f4;
  undefined2 local_f2;
  jit_State *local_f0;
  undefined2 local_e6;
  IRRef1 local_e4;
  undefined2 local_e2;
  jit_State *local_e0;
  ushort local_d6;
  IRRef1 local_d4;
  undefined2 local_d2;
  jit_State *local_d0;
  TValue *local_c8;
  TValue *local_c0;
  lua_State *local_b8;
  TValue *local_b0;
  TValue *local_a8;
  lua_State *local_a0;
  HotPenalty *local_98;
  TValue *local_90;
  lua_State *local_88;
  char *local_80;
  TValue *local_78;
  lua_State *local_70;
  char *local_68;
  TValue *local_60;
  lua_State *local_58;
  undefined4 local_4c;
  HotPenalty *local_48;
  TValue *local_40;
  lua_State *local_38;
  char *local_30;
  TValue *local_28;
  lua_State *local_20;
  undefined4 local_14;
  HotPenalty *local_10;
  TValue *local_8;
  
  local_138 = *(jit_State **)((long)in_RDX + 0x28);
  local_140 = *(uint *)((long)in_RDX + 0x34);
  local_148 = (jit_State *)(local_138->base + local_140);
  local_14c = *(uint *)((long)in_RDX + 0x30);
  local_13c = local_14c;
  local_130 = in_RDX;
  local_118 = in_RDI;
  for (; local_14c <= local_140; local_14c = local_14c + 1) {
    if (local_138->base[local_14c] == 0) {
      sload(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    }
  }
  if (((((local_148->cur).nextgc.gcptr32 >> 0x18 & 0x1f) - 0xe < 6) ||
      (((local_148->cur).nextgc.gcptr32 & 0x1f000000) == 0x4000000)) &&
     ((((uint)local_148[-1].prof_mode >> 0x18 & 0x1f) - 0xe < 6 ||
      ((local_148[-1].prof_mode & 0x1f000000U) == 0x4000000)))) {
    in_stack_fffffffffffffe48 = (jit_State *)(local_138->base + local_13c);
    for (pjVar3 = local_148; in_stack_fffffffffffffe48 <= pjVar3;
        pjVar3 = (jit_State *)&pjVar3[-1].prof_mode) {
      if (((pjVar3->cur).nextgc.gcptr32 >> 0x18 & 0x1f) - 0xe < 6) {
        local_d4 = (IRRef1)(pjVar3->cur).nextgc.gcptr32;
        local_d6 = (ushort)(((pjVar3->cur).nextgc.gcptr32 & 0x1f000000) == 0xe000000);
        local_d0 = local_138;
        local_d2 = 0x5b04;
        (local_138->fold).ins.field_0.ot = 0x5b04;
        (local_138->fold).ins.field_0.op1 = local_d4;
        *(ushort *)((long)&(local_138->fold).ins + 2) = local_d6;
        TVar1 = lj_opt_fold(in_stack_fffffffffffffe48);
        (pjVar3->cur).nextgc.gcptr32 = TVar1;
      }
      else if (((pjVar3->cur).nextgc.gcptr32 & 0x1f000000) != 0x4000000) break;
    }
    in_stack_fffffffffffffe50 = (jit_State *)&(pjVar3->cur).marked;
    in_stack_fffffffffffffe40 = local_138;
    pjVar3 = in_stack_fffffffffffffe50;
    TVar1 = lj_ir_kptr_((jit_State *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (IROp)((ulong)in_stack_fffffffffffffe50 >> 0x20),in_stack_fffffffffffffe50);
    local_e2 = 0x5305;
    local_e4 = (IRRef1)TVar1;
    local_e6 = 0;
    (in_stack_fffffffffffffe40->fold).ins.field_0.ot = 0x5305;
    (in_stack_fffffffffffffe40->fold).ins.field_0.op1 = local_e4;
    (in_stack_fffffffffffffe40->fold).ins.field_0.op2 = 0;
    local_e0 = in_stack_fffffffffffffe40;
    TVar2 = lj_opt_fold(in_stack_fffffffffffffe48);
    TVar1 = TVar2;
    do {
      local_f4 = (IRRef1)TVar1;
      pjVar4 = (jit_State *)&(pjVar3->cur).marked;
      local_f0 = local_138;
      local_f2 = 0x5405;
      local_f6 = (IRRef1)(pjVar3->cur).nextgc.gcptr32;
      (local_138->fold).ins.field_0.ot = 0x5405;
      (local_138->fold).ins.field_0.op1 = local_f4;
      (local_138->fold).ins.field_0.op2 = local_f6;
      TVar1 = lj_opt_fold(in_stack_fffffffffffffe48);
      pjVar3 = pjVar4;
    } while (pjVar4 <= local_148);
    local_104 = (IRRef1)TVar1;
    local_100 = local_138;
    local_102 = 0x5504;
    local_106 = (IRRef1)TVar2;
    (local_138->fold).ins.field_0.ot = 0x5504;
    (local_138->fold).ins.field_0.op1 = local_104;
    (local_138->fold).ins.field_0.op2 = local_106;
    TVar1 = lj_opt_fold(in_stack_fffffffffffffe48);
    local_138->maxslot = (BCReg)((long)in_stack_fffffffffffffe50 - (long)local_138->base >> 2);
    if (in_stack_fffffffffffffe50 == in_stack_fffffffffffffe48) {
      *(TRef *)((long)local_130 + 0x38) = TVar1;
      return (TValue *)0x0;
    }
    local_140 = local_138->maxslot;
    local_138->maxslot = local_140 - 1;
    *(uint *)((long)local_130 + 0x34) = local_140;
    memcpy(local_130,(void *)(*(long *)(local_118 + 0x10) + (ulong)(local_140 - 1) * 8),0x28);
    (in_stack_fffffffffffffe50->cur).nextgc.gcptr32 = TVar1;
    local_88 = local_138->L;
    local_90 = local_190;
    local_98 = local_138[-1].penalty + 0x3a;
    local_4c = 0xfffffffb;
    local_14 = 0xfffffffb;
    local_190[0].u32.lo = (int)local_98;
    local_190[0].field_2.it = 0xfffffffb;
    local_30 = "store to dead GC object";
    local_148 = in_stack_fffffffffffffe50;
    local_48 = local_98;
    local_40 = local_90;
    local_38 = local_88;
    local_28 = local_90;
    local_20 = local_88;
    local_10 = local_98;
    local_8 = local_90;
  }
  else {
    local_138->maxslot = local_140 - 1;
    local_a0 = local_138->L;
    local_a8 = local_190;
    local_b0 = local_138->L->base + local_140;
    local_190[0] = *local_b0;
    local_80 = "copy of dead GC object";
    local_78 = local_a8;
    local_70 = local_a0;
  }
  local_b8 = local_138->L;
  local_c0 = &local_198;
  local_c8 = local_138->L->base + (local_140 - 1);
  local_198 = *local_c8;
  local_68 = "copy of dead GC object";
  local_168 = local_148[-1].prof_mode;
  local_164 = (local_148->cur).nextgc.gcptr32;
  local_60 = local_c0;
  local_58 = local_b8;
  rec_mm_arith(in_stack_fffffffffffffe50,(RecordIndex *)in_stack_fffffffffffffe48,
               (MMS)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  *(undefined4 *)((long)local_130 + 0x38) = 0;
  return (TValue *)0x0;
}

Assistant:

static TValue *rec_mm_concat_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  RecCatDataCP *rcd = (RecCatDataCP *)ud;
  jit_State *J = rcd->J;
  BCReg baseslot = rcd->baseslot, topslot = rcd->topslot;
  TRef *top = &J->base[topslot];
  BCReg s;
  RecordIndex ix;
  UNUSED(L); UNUSED(dummy);
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) {
      rcd->tr = tr;  /* Return simple concatenation result. */
      return NULL;
    }
    /* Pass partial result. */
    rcd->topslot = topslot = J->maxslot--;
    /* Save updated range of slots. */
    memcpy(rcd->savetv, &L->base[topslot-1], sizeof(rcd->savetv));
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  rcd->tr = 0;  /* No result yet. */
  return NULL;
}